

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::EmitAddtlInfo_SnapGeneratorInfo(SnapObject *snpObject,FileWriter *writer)

{
  int32 *piVar1;
  ulong uVar2;
  
  if (snpObject->SnapObjectTag == SnapGenerator) {
    piVar1 = (int32 *)snpObject->AddtlSnapObjectInfo;
    FileWriter::WriteInt32(writer,i32Val,*piVar1,CommaSeparator);
    FileWriter::WriteInt32(writer,i32Val,piVar1[1],CommaSeparator);
    (*writer->_vptr_FileWriter[3])(writer,0x72,3);
    (*writer->_vptr_FileWriter[4])(writer,0);
    if (piVar1[1] != 0) {
      uVar2 = 0;
      do {
        NSSnapValues::EmitTTDVar(*(TTDVar *)(*(long *)(piVar1 + 2) + uVar2 * 8),writer,uVar2 != 0);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (uint)piVar1[1]);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    FileWriter::WriteUInt32(writer,u32Val,piVar1[4],CommaSeparator);
    FileWriter::WriteAddr(writer,objectId,*(TTD_PTR_ID *)(piVar1 + 6),CommaSeparator);
    FileWriter::WriteUInt32(writer,u32Val,piVar1[8],CommaSeparator);
    FileWriter::WriteUInt32(writer,u32Val,(uint)*(byte *)(piVar1 + 9),CommaSeparator);
    FileWriter::WriteUInt32(writer,u32Val,piVar1[10],CommaSeparator);
    (*writer->_vptr_FileWriter[3])(writer,0x73,3);
    (*writer->_vptr_FileWriter[4])(writer,0);
    if (piVar1[10] != 0) {
      uVar2 = 0;
      do {
        NSSnapValues::EmitTTDVar(*(TTDVar *)(*(long *)(piVar1 + 0xc) + uVar2 * 8),writer,uVar2 != 0)
        ;
        uVar2 = uVar2 + 1;
      } while (uVar2 < (uint)piVar1[10]);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    FileWriter::WriteUInt32(writer,u32Val,piVar1[0xe],CommaSeparator);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void EmitAddtlInfo_SnapGeneratorInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapGeneratorInfo* sgi = SnapObjectGetAddtlInfoAs<SnapGeneratorInfo*, SnapObjectType::SnapGenerator>(snpObject);

            writer->WriteInt32(NSTokens::Key::i32Val, sgi->generatorPrototype, NSTokens::Separator::CommaSeparator);

            writer->WriteInt32(NSTokens::Key::i32Val, sgi->frame_slotCount, NSTokens::Separator::CommaSeparator);

            // frame_slotArray
            writer->WriteKey(NSTokens::Key::frame_slotArray, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart();
            for(Js::RegSlot i = 0; i < sgi->frame_slotCount; ++i)
            {
                NSSnapValues::EmitTTDVar(sgi->frame_slotArray[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->state, NSTokens::Separator::CommaSeparator);
            writer->WriteAddr(NSTokens::Key::objectId, sgi->scriptFunction, NSTokens::Separator::CommaSeparator);

            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->arguments_callInfo_count, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->arguments_callInfo_flags, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->arguments_count, NSTokens::Separator::CommaSeparator);

            // arguments_values array
            writer->WriteKey(NSTokens::Key::arguments_values, NSTokens::Separator::CommaAndBigSpaceSeparator);
            writer->WriteSequenceStart();
            for(uint32 i = 0; i < sgi->arguments_count; ++i)
            {
                NSSnapValues::EmitTTDVar(sgi->arguments_values[i], writer, i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
            }
            writer->WriteSequenceEnd();

            writer->WriteUInt32(NSTokens::Key::u32Val, sgi->byteCodeReader_offset, NSTokens::Separator::CommaSeparator);
        }